

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::InitQueue(S2ClosestEdgeQueryBase<S2MaxDistance> *this)

{
  ulong uVar1;
  Iterator *this_00;
  double dVar2;
  S2CellId SVar3;
  S2CellId id;
  long lVar4;
  size_type sVar5;
  bool bVar6;
  CellRelation CVar7;
  reference ppSVar8;
  pointer pSVar9;
  S2ShapeIndexCell *index_cell;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  size_type sVar14;
  ulong uVar15;
  S1ChordAngle b;
  S2Cap search_cap;
  S2Cap cap;
  S2RegionCoverer coverer;
  S2Region local_e8;
  S2Point local_e0;
  double local_c8;
  undefined1 local_c0 [8];
  S2Point local_b8;
  S1ChordAngle local_a0;
  S2LogMessage local_98;
  undefined1 local_88 [16];
  S2ShapeIndexCell *local_78;
  
  if (1 < (this->queue_).c.allocator_and_tag_.tag_.size_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
               ,0x2b5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88._8_8_,"Check failed: queue_.empty() ",0x1d);
LAB_001f56b1:
    abort();
  }
  if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    S2ShapeIndex::Iterator::Init(&this->iter_,this->index_,UNPOSITIONED);
  }
  (*this->target_->_vptr_S2DistanceTarget[2])(local_c0);
  if (0.0 <= local_a0.length2_) {
    if (this->options_->max_results_ == 1) {
      bVar6 = S2ShapeIndex::Iterator::Locate(&this->iter_,&local_b8);
      if (bVar6) {
        S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_88,4.0);
        SVar3.id_ = (((this->iter_).iter_._M_t.
                      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_
                    ).id_;
        local_78 = S2ShapeIndex::Iterator::cell(&this->iter_);
        local_88._8_8_ = SVar3.id_;
        ProcessEdges(this,(QueueEntry *)local_88);
        dVar2 = (this->distance_limit_).distance_.length2_;
        S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_88,4.0);
        if ((dVar2 == (double)local_88._0_8_) && (!NAN(dVar2) && !NAN((double)local_88._0_8_))) {
          return;
        }
      }
    }
    if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      InitCovering(this);
    }
    dVar2 = (this->distance_limit_).distance_.length2_;
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_88,-1.0);
    if ((dVar2 != (double)local_88._0_8_) || (NAN(dVar2) || NAN((double)local_88._0_8_))) {
      S2RegionCoverer::S2RegionCoverer((S2RegionCoverer *)local_88);
      S2RegionCoverer::Options::set_max_cells((Options *)local_88,4);
      S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_e8,4.0);
      b = operator-((S1ChordAngle)local_e8._vptr_S2Region,(this->distance_limit_).distance_.length2_
                   );
      local_c8 = (double)operator+(local_a0,b);
      local_e8._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
      local_e0.c_[0] = local_b8.c_[0];
      local_e0.c_[1] = local_b8.c_[1];
      local_e0.c_[2] = local_b8.c_[2];
      bVar6 = S2::IsUnitLength(&local_e0);
      if (!bVar6 || 4.0 < local_c8) {
        S2LogMessage::S2LogMessage
                  (&local_98,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                   ,0xf5,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_98.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_001f56b1;
      }
      S2RegionCoverer::GetFastCovering
                ((S2RegionCoverer *)local_88,&local_e8,&this->max_distance_covering_);
      S2CellUnion::GetIntersection
                (&this->index_covering_,&this->max_distance_covering_,&this->initial_cells_);
      pSVar9 = (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar9) {
        this_00 = &this->iter_;
        uVar10 = 0;
        uVar15 = 0;
        sVar14 = 0;
        do {
          SVar3.id_ = pSVar9[uVar10].id_;
          sVar5 = (long)(int)sVar14;
          do {
            sVar14 = sVar5;
            id.id_ = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar14].id_;
            sVar5 = sVar14 + 1;
          } while ((id.id_ - 1 | id.id_) < SVar3.id_);
          iVar13 = (int)uVar15;
          if (SVar3.id_ == id.id_) {
            ppSVar8 = absl::
                      InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                      ::operator[](&this->index_cells_,sVar14);
            ProcessOrEnqueue(this,id,*ppSVar8);
            sVar14 = sVar14 + 1;
            uVar15 = (ulong)(iVar13 + 1);
          }
          else {
            CVar7 = S2ShapeIndex::Iterator::Locate(this_00,SVar3);
            if (CVar7 == SUBDIVIDED) {
              ProcessOrEnqueue(this,SVar3,(S2ShapeIndexCell *)0x0);
            }
            else if (CVar7 == INDEXED) {
              SVar3.id_ = (((this_00->iter_)._M_t.
                            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl
                           )->id_).id_;
              index_cell = S2ShapeIndex::Iterator::cell(this_00);
              ProcessOrEnqueue(this,SVar3,index_cell);
              pSVar9 = (this->initial_cells_).
                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                       super__Vector_impl_data._M_start;
              SVar3.id_ = (((this->iter_).iter_._M_t.
                            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl
                           )->id_).id_;
              uVar11 = (long)(this->initial_cells_).
                             super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pSVar9 >> 3;
              uVar10 = (long)iVar13;
              uVar12 = (long)(iVar13 + 1);
              if ((ulong)(long)(iVar13 + 1) < uVar11) {
                uVar12 = uVar11;
              }
              do {
                uVar1 = uVar10 + 1;
                uVar15 = uVar12;
                if (uVar11 <= uVar1) break;
                lVar4 = uVar10 + 1;
                uVar10 = uVar1;
                uVar15 = uVar1;
              } while (pSVar9[lVar4].id_ <= (SVar3.id_ - 1 | SVar3.id_));
              goto LAB_001f5634;
            }
            uVar15 = (ulong)(iVar13 + 1);
          }
LAB_001f5634:
          uVar10 = (ulong)(int)uVar15;
          pSVar9 = (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(this->initial_cells_).
                                        super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar9 >>
                                 3));
      }
      S2RegionCoverer::~S2RegionCoverer((S2RegionCoverer *)local_88);
    }
    else {
      pSVar9 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar9) {
        sVar14 = 0;
        do {
          SVar3.id_ = pSVar9[sVar14].id_;
          ppSVar8 = absl::
                    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ::operator[](&this->index_cells_,sVar14);
          ProcessOrEnqueue(this,SVar3,*ppSVar8);
          sVar14 = sVar14 + 1;
          pSVar9 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (sVar14 < (ulong)((long)(this->index_covering_).
                                        super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar9 >>
                                 3));
      }
    }
  }
  return;
}

Assistant:

int32 edge_id() const { return edge_id_; }